

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-base.h
# Opt level: O2

void __thiscall dynamicgraph::SignalBase<int>::plug(SignalBase<int> *this,SignalBase<int> *sigarg)

{
  ExceptionSignal *this_00;
  allocator<char> local_45;
  ErrorCodeEnum local_44;
  string local_40 [32];
  
  this_00 = (ExceptionSignal *)__cxa_allocate_exception(0x30);
  local_44 = PLUG_IMPOSSIBLE;
  std::__cxx11::string::string<std::allocator<char>>
            (local_40,"Plug-in operation not possible with this signal. ",&local_45);
  dynamicgraph::ExceptionSignal::ExceptionSignal
            (this_00,&local_44,local_40,"(while trying to plug %s on %s).",
             (sigarg->name)._M_dataplus._M_p,(this->name)._M_dataplus._M_p);
  __cxa_throw(this_00,&ExceptionSignal::typeinfo,ExceptionAbstract::~ExceptionAbstract);
}

Assistant:

virtual void plug(SignalBase<Time> *sigarg) {
    DG_THROW ExceptionSignal(
        ExceptionSignal::PLUG_IMPOSSIBLE,
        "Plug-in operation not possible with this signal. ",
        "(while trying to plug %s on %s).", sigarg->getName().c_str(),
        this->getName().c_str());
  }